

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitArrayNewElem(BinaryInstWriter *this,ArrayNewElem *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *this_01;
  U32LEB x;
  HeapType type;
  
  BufferWithRandomAccess::operator<<(this->o,-5);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)0xa);
  this_00 = this->parent;
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.
                     type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,type);
  this_01 = this->o;
  x.value = WasmBinaryWriter::getElementSegmentIndex
                      (this->parent,(Name)(curr->segment).super_IString.str);
  BufferWithRandomAccess::operator<<(this_01,x);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayNewElem(ArrayNewElem* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  o << U32LEB(BinaryConsts::ArrayNewElem);
  parent.writeIndexedHeapType(curr->type.getHeapType());
  o << U32LEB(parent.getElementSegmentIndex(curr->segment));
}